

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRenode.c
# Opt level: O3

int Abc_NtkRenodeEvalBdd(If_Man_t *p,If_Cut_t *pCut)

{
  word *pTruth;
  Vec_Mem_t *pVVar1;
  DdManager *dd;
  uint uVar2;
  int iVar3;
  word *pwVar4;
  DdNode *n;
  DdNode *n_00;
  ulong uVar5;
  char cVar6;
  uint uVar7;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  int pOrder [32];
  int local_a8 [34];
  ulong uVar8;
  long lVar11;
  
  uVar7 = *(uint *)&pCut->field_0x1c >> 0x18;
  uVar8 = (ulong)uVar7;
  if (0xffffff < *(uint *)&pCut->field_0x1c) {
    memset(&pCut[1].Area + uVar8,0x9c,(ulong)(uVar7 - 1) + 1);
    lVar11 = uVar8 - 1;
    auVar9._8_4_ = (int)lVar11;
    auVar9._0_8_ = lVar11;
    auVar9._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar5 = 0;
    auVar9 = auVar9 ^ _DAT_007ee2e0;
    auVar10 = _DAT_007ee2c0;
    auVar12 = _DAT_007ee2d0;
    do {
      auVar13 = auVar12 ^ _DAT_007ee2e0;
      iVar3 = auVar9._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar3 && auVar9._0_4_ < auVar13._0_4_ || iVar3 < auVar13._4_4_)
                & 1)) {
        *(undefined4 *)((long)local_a8 + uVar5) = 0xffffff9c;
      }
      if ((auVar13._12_4_ != auVar9._12_4_ || auVar13._8_4_ <= auVar9._8_4_) &&
          auVar13._12_4_ <= auVar9._12_4_) {
        *(undefined4 *)((long)local_a8 + uVar5 + 4) = 0xffffff9c;
      }
      iVar14 = SUB164(auVar10 ^ _DAT_007ee2e0,4);
      if (iVar14 <= iVar3 && (iVar14 != iVar3 || SUB164(auVar10 ^ _DAT_007ee2e0,0) <= auVar9._0_4_))
      {
        *(undefined4 *)((long)local_a8 + uVar5 + 8) = 0xffffff9c;
        *(undefined4 *)((long)local_a8 + uVar5 + 0xc) = 0xffffff9c;
      }
      lVar11 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar11 + 4;
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar11 + 4;
      uVar5 = uVar5 + 0x10;
    } while ((uVar7 * 4 + 0xc & 0xfffffff0) != uVar5);
  }
  dd = s_pDd;
  uVar7 = pCut->iCutFunc;
  if (-1 < (int)uVar7) {
    pTruth = p->puTempW;
    pVVar1 = p->vTtMem[uVar8];
    if (pVVar1 == (Vec_Mem_t *)0x0) {
      pwVar4 = (word *)0x0;
    }
    else {
      uVar2 = uVar7 >> 1;
      if (pVVar1->nEntries <= (int)uVar2) {
        __assert_fail("i >= 0 && i < p->nEntries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                      ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
      }
      pwVar4 = pVVar1->ppPages[uVar2 >> ((byte)pVVar1->LogPageSze & 0x1f)] +
               (ulong)(uVar2 & pVVar1->PageMask) * (long)pVVar1->nEntrySize;
    }
    uVar2 = p->nTruth6Words[uVar8];
    if ((uVar7 & 1) == 0) {
      if (0 < (int)uVar2) {
        uVar5 = 0;
        do {
          pTruth[uVar5] = pwVar4[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
    }
    else if (0 < (int)uVar2) {
      uVar5 = 0;
      do {
        pTruth[uVar5] = ~pwVar4[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
    }
    n = Kit_TruthToBdd(dd,(uint *)pTruth,(uint)(byte)pCut->field_0x1f,0);
    Cudd_Ref(n);
    n_00 = Extra_Reorder(s_pReo,s_pDd,n,local_a8);
    Cudd_Ref(n_00);
    uVar7 = *(uint *)&pCut->field_0x1c;
    if (0xffffff < uVar7) {
      uVar5 = 0;
      cVar6 = '\0';
      do {
        if (-1 < (long)local_a8[uVar5]) {
          cVar6 = cVar6 + '\x01';
          *(char *)((long)(&pCut[1].Area + uVar8) + (long)local_a8[uVar5]) = cVar6;
        }
        uVar5 = uVar5 + 1;
      } while (uVar7 >> 0x18 != uVar5);
    }
    iVar3 = Cudd_DagSize(n_00);
    Cudd_RecursiveDeref(s_pDd,n_00);
    Cudd_RecursiveDeref(s_pDd,n);
    return iVar3 + -1;
  }
  __assert_fail("pCut->iCutFunc >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/if.h"
                ,0x1aa,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
}

Assistant:

int Abc_NtkRenodeEvalBdd( If_Man_t * p, If_Cut_t * pCut )
{
    char * pPerm = If_CutPerm( pCut );
    int pOrder[IF_MAX_LUTSIZE];
    DdNode * bFunc, * bFuncNew;
    int i, k, nNodes;
    for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        pPerm[i] = pOrder[i] = -100;
    bFunc = Kit_TruthToBdd( s_pDd, If_CutTruth(p, pCut), If_CutLeaveNum(pCut), 0 );  Cudd_Ref( bFunc );
    bFuncNew = Extra_Reorder( s_pReo, s_pDd, bFunc, pOrder );                     Cudd_Ref( bFuncNew );
    for ( i = k = 0; i < If_CutLeaveNum(pCut); i++ )
        if ( pOrder[i] >= 0 )
            pPerm[pOrder[i]] = ++k; // double-check this!
    nNodes = -1 + Cudd_DagSize( bFuncNew );
    Cudd_RecursiveDeref( s_pDd, bFuncNew );
    Cudd_RecursiveDeref( s_pDd, bFunc );
    return nNodes; 
}